

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O1

bool __thiscall TripleBuffer<stStateUI>::update(TripleBuffer<stStateUI> *this,bool force)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  byte bVar13;
  
  iVar12 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar12 == 0) {
    bVar13 = this->hasChanged ^ 1U | force;
    if (bVar13 == 1) {
      this->hasChanged = true;
      bVar1 = (this->super_stStateUI).flags.resetOptimization;
      bVar2 = (this->super_stStateUI).flags.changeProcessing;
      bVar3 = (this->super_stStateUI).flags.applyParameters;
      (this->buffer).flags.recalculateSimilarityMap =
           (this->super_stStateUI).flags.recalculateSimilarityMap;
      (this->buffer).flags.resetOptimization = bVar1;
      (this->buffer).flags.changeProcessing = bVar2;
      (this->buffer).flags.applyParameters = bVar3;
      (this->buffer).flags.applyHints = (this->super_stStateUI).flags.applyHints;
      if (((this->super_stStateUI).flags.recalculateSimilarityMap != false) ||
         ((this->super_stStateUI).flags.resetOptimization == true)) {
        iVar12 = (this->super_stStateUI).params.nHypothesesToKeep;
        (this->buffer).params.wEnglish = (this->super_stStateUI).params.wEnglish;
        (this->buffer).params.nHypothesesToKeep = iVar12;
        iVar4 = (this->super_stStateUI).params.keyPressWidth_samples;
        iVar5 = (this->super_stStateUI).params.offsetFromPeak_samples;
        iVar6 = (this->super_stStateUI).params.alignWindow_samples;
        (this->buffer).params.playbackId = (this->super_stStateUI).params.playbackId;
        (this->buffer).params.keyPressWidth_samples = iVar4;
        (this->buffer).params.offsetFromPeak_samples = iVar5;
        (this->buffer).params.alignWindow_samples = iVar6;
        std::vector<int,_std::allocator<int>_>::operator=
                  (&(this->buffer).params.valuesClusters,
                   &(this->super_stStateUI).params.valuesClusters);
        std::vector<float,_std::allocator<float>_>::operator=
                  (&(this->buffer).params.valuesFSpread,
                   &(this->super_stStateUI).params.valuesFSpread);
        iVar12 = (this->super_stStateUI).params.cipher.nHypothesesToKeep;
        (this->buffer).params.cipher.wEnglishFreq =
             (this->super_stStateUI).params.cipher.wEnglishFreq;
        (this->buffer).params.cipher.nHypothesesToKeep = iVar12;
        iVar12 = (this->super_stStateUI).params.cipher.minClusters;
        iVar9 = (this->super_stStateUI).params.cipher.maxClusters;
        iVar10 = (this->super_stStateUI).params.cipher.nInitialIters;
        iVar11 = (this->super_stStateUI).params.cipher.nIters;
        fVar7 = (this->super_stStateUI).params.cipher.temp0;
        fVar8 = (this->super_stStateUI).params.cipher.coolingRate;
        (this->buffer).params.cipher.fSpread = (this->super_stStateUI).params.cipher.fSpread;
        (this->buffer).params.cipher.temp0 = fVar7;
        (this->buffer).params.cipher.coolingRate = fVar8;
        (this->buffer).params.cipher.minClusters = iVar12;
        (this->buffer).params.cipher.maxClusters = iVar9;
        (this->buffer).params.cipher.nInitialIters = iVar10;
        (this->buffer).params.cipher.nIters = iVar11;
        std::vector<int,_std::allocator<int>_>::operator=
                  (&(this->buffer).params.cipher.hint,&(this->super_stStateUI).params.cipher.hint);
        std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator=
                  (&(this->buffer).keyPresses.
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>,
                   &(this->super_stStateUI).keyPresses.
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>);
        (this->buffer).keyPresses.nClusters = (this->super_stStateUI).keyPresses.nClusters;
      }
      if ((this->super_stStateUI).flags.changeProcessing == true) {
        (this->buffer).processing = (this->super_stStateUI).processing;
      }
      if ((this->super_stStateUI).flags.applyParameters == true) {
        iVar12 = (this->super_stStateUI).params.nHypothesesToKeep;
        (this->buffer).params.wEnglish = (this->super_stStateUI).params.wEnglish;
        (this->buffer).params.nHypothesesToKeep = iVar12;
        iVar4 = (this->super_stStateUI).params.keyPressWidth_samples;
        iVar5 = (this->super_stStateUI).params.offsetFromPeak_samples;
        iVar6 = (this->super_stStateUI).params.alignWindow_samples;
        (this->buffer).params.playbackId = (this->super_stStateUI).params.playbackId;
        (this->buffer).params.keyPressWidth_samples = iVar4;
        (this->buffer).params.offsetFromPeak_samples = iVar5;
        (this->buffer).params.alignWindow_samples = iVar6;
        std::vector<int,_std::allocator<int>_>::operator=
                  (&(this->buffer).params.valuesClusters,
                   &(this->super_stStateUI).params.valuesClusters);
        std::vector<float,_std::allocator<float>_>::operator=
                  (&(this->buffer).params.valuesFSpread,
                   &(this->super_stStateUI).params.valuesFSpread);
        iVar12 = (this->super_stStateUI).params.cipher.nHypothesesToKeep;
        (this->buffer).params.cipher.wEnglishFreq =
             (this->super_stStateUI).params.cipher.wEnglishFreq;
        (this->buffer).params.cipher.nHypothesesToKeep = iVar12;
        iVar12 = (this->super_stStateUI).params.cipher.minClusters;
        iVar9 = (this->super_stStateUI).params.cipher.maxClusters;
        iVar10 = (this->super_stStateUI).params.cipher.nInitialIters;
        iVar11 = (this->super_stStateUI).params.cipher.nIters;
        fVar7 = (this->super_stStateUI).params.cipher.temp0;
        fVar8 = (this->super_stStateUI).params.cipher.coolingRate;
        (this->buffer).params.cipher.fSpread = (this->super_stStateUI).params.cipher.fSpread;
        (this->buffer).params.cipher.temp0 = fVar7;
        (this->buffer).params.cipher.coolingRate = fVar8;
        (this->buffer).params.cipher.minClusters = iVar12;
        (this->buffer).params.cipher.maxClusters = iVar9;
        (this->buffer).params.cipher.nInitialIters = iVar10;
        (this->buffer).params.cipher.nIters = iVar11;
        std::vector<int,_std::allocator<int>_>::operator=
                  (&(this->buffer).params.cipher.hint,&(this->super_stStateUI).params.cipher.hint);
      }
      if ((this->super_stStateUI).flags.applyHints == true) {
        std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator=
                  (&(this->buffer).keyPresses.
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>,
                   &(this->super_stStateUI).keyPresses.
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>);
        (this->buffer).keyPresses.nClusters = (this->super_stStateUI).keyPresses.nClusters;
      }
      (this->super_stStateUI).flags.applyHints = false;
      (this->super_stStateUI).flags.recalculateSimilarityMap = false;
      (this->super_stStateUI).flags.resetOptimization = false;
      (this->super_stStateUI).flags.changeProcessing = false;
      (this->super_stStateUI).flags.applyParameters = false;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return (bool)bVar13;
  }
  std::__throw_system_error(iVar12);
}

Assistant:

bool TripleBuffer<stStateUI>::update(bool force) {
    std::lock_guard<std::mutex> lock(mutex);
    if (hasChanged && force == false) return false;

    hasChanged = true;

    buffer.flags = this->flags;

    if (this->flags.recalculateSimilarityMap || this->flags.resetOptimization) {
        buffer.params = this->params;
        buffer.keyPresses = this->keyPresses;
    }

    if (this->flags.changeProcessing) {
        buffer.processing = this->processing;
    }

    if (this->flags.applyParameters) {
        buffer.params = this->params;
    }

    if (this->flags.applyHints) {
        buffer.keyPresses = this->keyPresses;
    }

    this->flags.clear();

    return true;
}